

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

void __thiscall JsonParser_serialize_array_Test::TestBody(JsonParser_serialize_array_Test *this)

{
  long lVar1;
  char *pcVar2;
  initializer_list<jessilib::object> __l;
  AssertionResult gtest_ar;
  json_parser parser;
  vector<jessilib::object,_std::allocator<jessilib::object>_> array;
  internal local_168 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_158;
  code *local_138;
  vector<jessilib::object,_std::allocator<jessilib::object>_> local_130;
  _Variadic_union<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_118;
  undefined1 local_e8;
  undefined8 local_d8;
  undefined1 local_a8;
  object local_98;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_138 = __cxa_guard_release;
  local_118._M_rest._0_1_ = (undefined1)true;
  local_e8 = 1;
  local_d8 = 0x4d2;
  local_a8 = 2;
  jessilib::object::object(&local_98,"text");
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_118;
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::vector
            (&local_130,__l,(allocator_type *)&local_158);
  lVar1 = 0xc0;
  do {
    std::__detail::__variant::
    _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
    ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                         *)((long)&local_118 + lVar1));
    lVar1 = lVar1 + -0x40;
  } while (lVar1 != -0x40);
  jessilib::object::
  object<std::vector<jessilib::object,_std::allocator<jessilib::object>_>_&,_nullptr>
            ((object *)&local_118._M_first,&local_130);
  (**(code **)(local_138 + 0x30))(&local_158,&local_138,&local_118);
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,char8_t[24]>
            (local_168,"parser.serialize<char8_t>(array)",
             "u8R\"json([true,1234,\"text\",null])json\"",&local_158,
             (char8_t (*) [24])"[true,1234,\"text\",null]");
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_118._M_first);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_118._M_first);
    if (local_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_160->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_158,(Message *)&local_118._M_first);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    if ((long *)CONCAT71(local_118._1_7_,local_118._M_rest._M_first._M_storage) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_118._1_7_,local_118._M_rest._M_first._M_storage) + 8))();
    }
  }
  if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_160,local_160);
  }
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector(&local_130);
  return;
}

Assistant:

TEST(JsonParser, serialize_boolean) {
	json_parser parser;

	EXPECT_EQ(parser.serialize<char8_t>(true), u8"true");
	EXPECT_EQ(parser.serialize<char8_t>(false), u8"false");
}